

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O2

void __thiscall
cppcms::impl::cgi::connection::async_write_response
          (connection *this,response *response,bool complete_response,ehandler *h)

{
  int iVar1;
  async_write_binder *paVar2;
  undefined4 extraout_var;
  intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> tmp;
  intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> local_80;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_78;
  intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder> local_70;
  __shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2> local_68;
  _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  local_50;
  error_code e;
  
  tmp.p_ = (async_write_binder *)0x0;
  paVar2 = (this->cached_async_write_binder_).p_;
  if (paVar2 == (async_write_binder *)0x0) {
    paVar2 = (async_write_binder *)operator_new(0x30);
    (paVar2->h).call_ptr.p_ = (callable<void_(cppcms::http::context::completion_type)> *)0x0;
    *(undefined8 *)&paVar2->complete_response = 0;
    (paVar2->conn).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (paVar2->conn).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (paVar2->super_callable<void_(const_std::error_code_&)>).super_refcounted._vptr_refcounted =
         (_func_int **)0x0;
    *(undefined8 *)&(paVar2->super_callable<void_(const_std::error_code_&)>).super_refcounted.refs_
         = 0;
    async_write_binder::async_write_binder(paVar2);
    booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::operator=
              (&tmp,paVar2);
  }
  else {
    (this->cached_async_write_binder_).p_ = (async_write_binder *)0x0;
    tmp.p_ = paVar2;
  }
  std::__shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::cgi::connection,void>
            ((__shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             (__weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<cppcms::impl::cgi::connection>);
  std::__shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((tmp.p_)->conn).
              super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>,
             &local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  booster::callback<void_(cppcms::http::context::completion_type)>::operator=(&(tmp.p_)->h,h);
  (tmp.p_)->complete_response = complete_response;
  e._M_value = 0;
  e._M_cat = (error_category *)std::_V2::system_category();
  iVar1 = cppcms::http::response::flush_async_chunk(response,&e);
  if ((iVar1 == 0) &&
     ((this->pending_output_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->pending_output_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_68._M_ptr._0_4_ = 0;
    local_50._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_50._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::intrusive_ptr
              (&local_80,&tmp);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::
    intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>(&local_78,&local_80);
    (*this->_vptr_connection[5])(this,&local_68,0,&local_78);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_78);
    booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::~intrusive_ptr
              (&local_80);
    std::
    _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::~_Vector_base(&local_50);
  }
  else {
    iVar1 = (*this->_vptr_connection[0xc])(this);
    booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::intrusive_ptr
              (&local_70,&tmp);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::
    intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_68,
               &local_70);
    booster::aio::io_service::post((callback *)CONCAT44(extraout_var,iVar1),(error_code *)&local_68)
    ;
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_68);
    booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::~intrusive_ptr
              (&local_70);
  }
  booster::intrusive_ptr<cppcms::impl::cgi::connection::async_write_binder>::~intrusive_ptr(&tmp);
  return;
}

Assistant:

void connection::async_write_response(	http::response &response,
					bool complete_response,
					ehandler const &h)
{
	//  prepare cached binder
	booster::intrusive_ptr<connection::async_write_binder> tmp;
	if(cached_async_write_binder_) {
		tmp.swap(cached_async_write_binder_);
	}
	if(!tmp) {
		tmp = new connection::async_write_binder();
	}
	tmp->conn = self();
	tmp->h = h;
	tmp->complete_response = complete_response;
	// ready

	booster::system::error_code e;
	if(response.flush_async_chunk(e)!=0 || !has_pending()) {
		get_io_service().post(tmp,e);
		return;
	}
	async_write(booster::aio::const_buffer(),false,tmp);
}